

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_system_memory.c
# Opt level: O3

SUNErrCode SUNMemoryHelper_Dealloc_Sys(SUNMemoryHelper helper,SUNMemory mem,void *queue)

{
  long *plVar1;
  void *__ptr;
  void *pvVar2;
  
  if (mem != (SUNMemory)0x0) {
    __ptr = mem->ptr;
    if (((__ptr != (void *)0x0) && (mem->own != 0)) && (mem->type == SUNMEMTYPE_HOST)) {
      pvVar2 = helper->content;
      plVar1 = (long *)((long)pvVar2 + 8);
      *plVar1 = *plVar1 + 1;
      plVar1 = (long *)((long)pvVar2 + 0x10);
      *plVar1 = *plVar1 - mem->bytes;
      free(__ptr);
    }
    free(mem);
  }
  return 0;
}

Assistant:

SUNErrCode SUNMemoryHelper_Dealloc_Sys(SUNMemoryHelper helper, SUNMemory mem,
                                       SUNDIALS_MAYBE_UNUSED void* queue)
{
  SUNFunctionBegin(helper->sunctx);

  if (mem == NULL) { return SUN_SUCCESS; }

  SUNAssert(mem->type == SUNMEMTYPE_HOST, SUN_ERR_ARG_INCOMPATIBLE);

  if (mem->ptr != NULL && mem->own)
  {
    if (mem->type == SUNMEMTYPE_HOST)
    {
      SUNHELPER_CONTENT(helper)->num_deallocations++;
      SUNHELPER_CONTENT(helper)->bytes_allocated -= mem->bytes;
      free(mem->ptr);
      mem->ptr = NULL;
    }
  }

  free(mem);
  return SUN_SUCCESS;
}